

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

HDRImageBuffer * load_exr(char *file_path)

{
  undefined4 uVar1;
  float fVar2;
  uchar *puVar3;
  uchar *puVar4;
  uchar *puVar5;
  pointer pSVar6;
  int iVar7;
  ostream *poVar8;
  HDRImageBuffer *this;
  int i;
  long lVar9;
  size_t i_1;
  long lVar10;
  char *err;
  EXRImage exr;
  
  exr.images = (uchar **)0x0;
  exr.pixel_types = (int *)0x0;
  exr.num_custom_attributes = 0;
  exr.num_channels = 0;
  exr.channel_names = (char **)0x0;
  exr.requested_pixel_types = (int *)0x0;
  iVar7 = ParseMultiChannelEXRHeaderFromFile(&exr,file_path,&err);
  if (iVar7 == 0) {
    for (lVar9 = 0; lVar9 < exr.num_channels; lVar9 = lVar9 + 1) {
      if (exr.pixel_types[lVar9] == 1) {
        exr.requested_pixel_types[lVar9] = 2;
      }
    }
    iVar7 = LoadMultiChannelEXRFromFile(&exr,file_path,&err);
    if (iVar7 != 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"[Scotty3D] ");
      poVar8 = std::operator<<(poVar8,"Error loading OpenEXR file: ");
      poVar8 = std::operator<<(poVar8,err);
      std::endl<char,std::char_traits<char>>(poVar8);
      exit(1);
    }
    this = (HDRImageBuffer *)operator_new(0x28);
    (this->data).super__Vector_base<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this->w = 0;
    this->h = 0;
    (this->data).super__Vector_base<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->data).super__Vector_base<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    CMU462::HDRImageBuffer::resize(this,(long)exr.width,(long)exr.height);
    puVar3 = exr.images[2];
    puVar4 = *exr.images;
    puVar5 = exr.images[1];
    lVar9 = 2;
    for (lVar10 = 0; (long)exr.height * (long)exr.width - lVar10 != 0; lVar10 = lVar10 + 1) {
      uVar1 = *(undefined4 *)(puVar5 + lVar10 * 4);
      fVar2 = *(float *)(puVar4 + lVar10 * 4);
      pSVar6 = (this->data).super__Vector_base<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)((long)pSVar6 + lVar9 * 4 + -8) = *(undefined4 *)(puVar3 + lVar10 * 4);
      *(undefined4 *)((long)pSVar6 + lVar9 * 4 + -4) = uVar1;
      (&pSVar6->r)[lVar9] = fVar2;
      lVar9 = lVar9 + 3;
    }
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cerr,"[Scotty3D] ");
    poVar8 = std::operator<<(poVar8,"Error parsing OpenEXR file: ");
    poVar8 = std::operator<<(poVar8,err);
    std::endl<char,std::char_traits<char>>(poVar8);
    this = (HDRImageBuffer *)0x0;
  }
  return this;
}

Assistant:

HDRImageBuffer* load_exr(const char* file_path) {

  const char* err;

  EXRImage exr;
  InitEXRImage(&exr);

  int ret = ParseMultiChannelEXRHeaderFromFile(&exr, file_path, &err);
  if (ret != 0) {
    msg("Error parsing OpenEXR file: " << err);
    return NULL;
  }

  for (int i = 0; i < exr.num_channels; i++) {
    if (exr.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  ret = LoadMultiChannelEXRFromFile(&exr, file_path, &err);
  if (ret != 0) {
    msg("Error loading OpenEXR file: " << err);
    exit(EXIT_FAILURE);
  }

  HDRImageBuffer* envmap = new HDRImageBuffer();
  envmap->resize(exr.width, exr.height);
  float* channel_r = (float*) exr.images[2];
  float* channel_g = (float*) exr.images[1];
  float* channel_b = (float*) exr.images[0];
  for (size_t i = 0; i < exr.width * exr.height; i++) {
    envmap->data[i] = Spectrum(channel_r[i], 
        channel_g[i], 
        channel_b[i]);
  }

  return envmap;
}